

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyMemory.cpp
# Opt level: O0

WebAssemblyMemory *
Js::WebAssemblyMemory::CreateForExistingBuffer
          (uint32 initial,uint32 maximum,uint32 currentByteLength,ScriptContext *scriptContext)

{
  code *pcVar1;
  ArrayBufferBase *buffer_00;
  uint32 maximum_00;
  uint32 initial_00;
  bool bVar2;
  int iVar3;
  JavascriptLibrary *pJVar4;
  undefined4 *puVar5;
  Recycler *pRVar6;
  WebAssemblyMemory *this;
  DynamicType *type;
  TrackAllocData local_58;
  ArrayBufferBase *local_30;
  ArrayBufferBase *buffer;
  ScriptContext *scriptContext_local;
  uint32 local_18;
  uint32 currentByteLength_local;
  uint32 maximum_local;
  uint32 initial_local;
  
  buffer = (ArrayBufferBase *)scriptContext;
  scriptContext_local._4_4_ = currentByteLength;
  local_18 = maximum;
  currentByteLength_local = initial;
  CheckLimits(scriptContext,initial,maximum,currentByteLength);
  pJVar4 = ScriptContext::GetLibrary((ScriptContext *)buffer);
  local_30 = (ArrayBufferBase *)
             JavascriptLibrary::CreateWebAssemblyArrayBuffer(pJVar4,scriptContext_local._4_4_);
  if (local_30 == (ArrayBufferBase *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyMemory.cpp"
                                ,0x140,"(buffer)","buffer");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((scriptContext_local._4_4_ != 0) &&
     (iVar3 = (**(code **)((long)(((JavascriptArrayBuffer *)&local_30->super_DynamicObject)->
                                 super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
                                 super_RecyclableObject.super_FinalizableObject.
                                 super_IRecyclerVisitedObject + 0x388))(), iVar3 == 0)) {
    return (WebAssemblyMemory *)0x0;
  }
  pRVar6 = ScriptContext::GetRecycler((ScriptContext *)buffer);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyMemory.cpp"
             ,0x146);
  pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_58);
  this = (WebAssemblyMemory *)new<Memory::Recycler>(0x30,pRVar6,0x4642b0);
  initial_00 = currentByteLength_local;
  maximum_00 = local_18;
  buffer_00 = local_30;
  pJVar4 = ScriptContext::GetLibrary((ScriptContext *)buffer);
  type = JavascriptLibrary::GetWebAssemblyMemoryType(pJVar4);
  WebAssemblyMemory(this,buffer_00,initial_00,maximum_00,type);
  return this;
}

Assistant:

WebAssemblyMemory * WebAssemblyMemory::CreateForExistingBuffer(uint32 initial, uint32 maximum, uint32 currentByteLength, ScriptContext * scriptContext)
{
    CheckLimits(scriptContext, initial, maximum, currentByteLength);
    ArrayBufferBase* buffer = scriptContext->GetLibrary()->CreateWebAssemblyArrayBuffer(currentByteLength);
    Assert(buffer);
    if (currentByteLength > 0 && buffer->GetByteLength() == 0)
    {
        // Failed to allocate buffer
        return nullptr;
    }
    return RecyclerNewFinalized(scriptContext->GetRecycler(), WebAssemblyMemory, buffer, initial, maximum, scriptContext->GetLibrary()->GetWebAssemblyMemoryType());
}